

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O3

void __thiscall chrono::geometry::ChLinePath::ChLinePath(ChLinePath *this,ChLinePath *source)

{
  ChLine::ChLine(&this->super_ChLine,&source->super_ChLine);
  (this->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChLinePath_00b3d9e0;
  (this->lines).
  super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lines).
  super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::operator=(&this->lines,&source->lines);
  std::vector<double,_std::allocator<double>_>::operator=(&this->end_times,&source->end_times);
  std::vector<double,_std::allocator<double>_>::operator=(&this->durations,&source->durations);
  return;
}

Assistant:

ChLinePath::ChLinePath(const ChLinePath& source) : ChLine(source) {
    lines = source.lines;
    end_times = source.end_times;
    durations = source.durations;
}